

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<unsigned_char,unsigned_int,12>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uchar *lhs,uint *rhs,uint *result)

{
  uint *in_RDX;
  uint *in_RSI;
  byte *in_RDI;
  uchar tmp;
  
  if (*in_RSI <= (uint)*in_RDI) {
    SafeCastHelper<unsigned_int,unsigned_char,0>::
    CastThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (*in_RDI - (char)*in_RSI,in_RDX);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, U& result ) SAFEINT_CPP_THROW
    {
        // both are unsigned - easy case
        if( rhs <= lhs )
        {
            T tmp = (T)(lhs - rhs);
            SafeCastHelper< U, T, GetCastMethod<U, T>::method >::template CastThrow<E>( tmp, result);
            return;
        }

        E::SafeIntOnOverflow();
    }